

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS ref_metric_inspect(REF_NODE ref_node)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  REF_DBL m [6];
  REF_DBL aRStack_58 [7];
  
  iVar1 = ref_node->max;
  if (0 < iVar1) {
    lVar3 = 0;
    do {
      if (-1 < ref_node->global[lVar3]) {
        uVar2 = ref_node_metric_get(ref_node,(REF_INT)lVar3,aRStack_58);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0x36,"ref_metric_inspect",(ulong)uVar2,"get");
          return uVar2;
        }
        ref_metric_show(aRStack_58);
        iVar1 = ref_node->max;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < iVar1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_metric_inspect(REF_NODE ref_node) {
  REF_INT node;
  REF_DBL m[6];
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_node_metric_get(ref_node, node, m), "get");
    RSS(ref_metric_show(m), "show it");
  }
  return REF_SUCCESS;
}